

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

Orphan<capnp::DynamicList> * __thiscall
capnp::Orphan<capnp::DynamicValue>::releaseAs<capnp::DynamicList>
          (Orphan<capnp::DynamicList> *__return_storage_ptr__,Orphan<capnp::DynamicValue> *this)

{
  Type schema;
  bool bVar1;
  OrphanBuilder *builder;
  Fault local_58;
  Fault f;
  Type *local_48;
  undefined1 local_40 [8];
  DebugComparison<capnp::DynamicValue::Type_&,_capnp::DynamicValue::Type> _kjCondition;
  Orphan<capnp::DynamicValue> *this_local;
  
  _kjCondition._32_8_ = this;
  local_48 = (Type *)kj::_::DebugExpressionStart::operator<<
                               ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&this->type);
  f.exception._4_4_ = 8;
  kj::_::DebugExpression<capnp::DynamicValue::Type&>::operator==
            ((DebugComparison<capnp::DynamicValue::Type_&,_capnp::DynamicValue::Type> *)local_40,
             (DebugExpression<capnp::DynamicValue::Type&> *)&local_48,
             (Type *)((long)&f.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_40);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::DynamicValue::Type&,capnp::DynamicValue::Type>&,char_const(&)[21]>
              (&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x86d,FAILED,"type == DynamicValue::LIST","_kjCondition,\"Value type mismatch.\"",
               (DebugComparison<capnp::DynamicValue::Type_&,_capnp::DynamicValue::Type> *)local_40,
               (char (*) [21])"Value type mismatch.");
    kj::_::Debug::Fault::fatal(&local_58);
  }
  this->type = UNKNOWN;
  schema = (this->field_1).listSchema.elementType;
  builder = kj::mv<capnp::_::OrphanBuilder>(&this->builder);
  capnp::Orphan<capnp::DynamicList>::Orphan(__return_storage_ptr__,(ListSchema)schema,builder);
  return __return_storage_ptr__;
}

Assistant:

Orphan<DynamicList> Orphan<DynamicValue>::releaseAs<DynamicList>() {
  KJ_REQUIRE(type == DynamicValue::LIST, "Value type mismatch.");
  type = DynamicValue::UNKNOWN;
  return Orphan<DynamicList>(listSchema, kj::mv(builder));
}